

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int ReadHuffmanCode(int alphabet_size,VP8LDecoder *dec,int *code_lengths,HuffmanCode *table)

{
  VP8LBitReader *br;
  int iVar1;
  byte bVar2;
  ushort uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  uint *puVar12;
  int iVar13;
  ulong uVar14;
  bool bVar15;
  bool bVar16;
  int code_length_code_lengths [19];
  uint local_2a4;
  uint32_t local_288 [20];
  HuffmanCode local_238 [130];
  
  br = &dec->br_;
  bVar16 = true;
  uVar4 = VP8LReadBits(br,1);
  memset(code_lengths,0,(long)alphabet_size << 2);
  if (uVar4 != 0) {
    uVar4 = VP8LReadBits(br,1);
    uVar5 = VP8LReadBits(br,1);
    iVar8 = 8;
    if (uVar5 == 0) {
      iVar8 = 1;
    }
    uVar5 = VP8LReadBits(br,iVar8);
    code_lengths[(int)uVar5] = 1;
    if (uVar4 == 1) {
      uVar4 = VP8LReadBits(br,8);
      code_lengths[(int)uVar4] = 1;
    }
    goto LAB_00110d54;
  }
  local_288[0x10] = 0;
  local_288[0x11] = 0;
  local_288[0x12] = 0;
  local_288[0xc] = 0;
  local_288[0xd] = 0;
  local_288[0xe] = 0;
  local_288[0xf] = 0;
  local_288[8] = 0;
  local_288[9] = 0;
  local_288[10] = 0;
  local_288[0xb] = 0;
  local_288[4] = 0;
  local_288[5] = 0;
  local_288[6] = 0;
  local_288[7] = 0;
  local_288[0] = 0;
  local_288[1] = 0;
  local_288[2] = 0;
  local_288[3] = 0;
  uVar4 = VP8LReadBits(br,4);
  uVar11 = uVar4 + 4;
  if ((int)uVar11 < 0x14) {
    if (0 < (int)uVar11) {
      uVar14 = 0;
      do {
        uVar4 = VP8LReadBits(br,3);
        local_288["\x11\x12"[uVar14]] = uVar4;
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
    iVar8 = VP8LBuildHuffmanTable(local_238,7,(int *)local_288,0x13);
    bVar16 = false;
    bVar15 = true;
    if (iVar8 != 0) {
      uVar4 = VP8LReadBits(br,1);
      iVar8 = alphabet_size;
      if (uVar4 == 0) {
LAB_00110bfb:
        iVar13 = 0;
        local_2a4 = 8;
        bVar16 = true;
        do {
          if (alphabet_size <= iVar13) {
            bVar15 = false;
            goto LAB_00110d43;
          }
          iVar10 = 4;
          bVar15 = iVar8 != 0;
          iVar8 = iVar8 + -1;
          if (bVar15) {
            if (0x1f < (dec->br_).bit_pos_) {
              VP8LDoFillBitWindow(br);
            }
            iVar10 = (dec->br_).bit_pos_;
            uVar6 = (uint)((dec->br_).val_ >> ((byte)iVar10 & 0x3f)) & 0x7f;
            (dec->br_).bit_pos_ = (uint)local_238[uVar6].bits + iVar10;
            uVar3 = local_238[uVar6].value;
            if (uVar3 < 0x10) {
              lVar9 = (long)iVar13;
              iVar13 = iVar13 + 1;
              uVar6 = (uint)uVar3;
              code_lengths[lVar9] = uVar6;
              if (uVar6 != 0) {
                local_2a4 = uVar6;
              }
LAB_00110c7f:
              iVar10 = 0;
            }
            else {
              bVar2 = "\x03\x03\v"[uVar3 - 0x10];
              uVar4 = VP8LReadBits(br,(uint)"\x02\x03\a"[uVar3 - 0x10]);
              iVar7 = uVar4 + bVar2;
              iVar1 = iVar7 + iVar13;
              iVar10 = 2;
              if (iVar1 <= alphabet_size) {
                iVar10 = 0;
                uVar6 = 0;
                if (uVar3 == 0x10) {
                  uVar6 = local_2a4;
                }
                if (iVar7 < 1) goto LAB_00110c7f;
                puVar12 = (uint *)(code_lengths + iVar13);
                iVar7 = uVar4 + bVar2 + 1;
                do {
                  *puVar12 = uVar6;
                  puVar12 = puVar12 + 1;
                  iVar7 = iVar7 + -1;
                  iVar13 = iVar1;
                } while (1 < iVar7);
              }
            }
          }
        } while (iVar10 == 0);
        if (iVar10 == 4) {
          bVar15 = false;
          goto LAB_00110d43;
        }
      }
      else {
        uVar4 = VP8LReadBits(br,3);
        uVar4 = VP8LReadBits(br,uVar4 * 2 + 2);
        iVar8 = uVar4 + 2;
        if (iVar8 <= alphabet_size) goto LAB_00110bfb;
      }
      bVar16 = false;
      bVar15 = true;
    }
LAB_00110d43:
    if (bVar15) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    }
  }
  else {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    bVar16 = false;
  }
  if (0x13 < (int)uVar11) {
    return 0;
  }
LAB_00110d54:
  iVar8 = 0;
  if (bVar16) {
    bVar16 = (dec->br_).eos_ == 0;
  }
  else {
    bVar16 = false;
  }
  if (bVar16) {
    iVar8 = VP8LBuildHuffmanTable(table,8,code_lengths,alphabet_size);
  }
  if (!(bool)(bVar16 & iVar8 != 0)) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

static int ReadHuffmanCode(int alphabet_size, VP8LDecoder* const dec,
                           int* const code_lengths, HuffmanCode* const table) {
  int ok = 0;
  int size = 0;
  VP8LBitReader* const br = &dec->br_;
  const int simple_code = VP8LReadBits(br, 1);

  memset(code_lengths, 0, alphabet_size * sizeof(*code_lengths));

  if (simple_code) {  // Read symbols, codes & code lengths directly.
    const int num_symbols = VP8LReadBits(br, 1) + 1;
    const int first_symbol_len_code = VP8LReadBits(br, 1);
    // The first code is either 1 bit or 8 bit code.
    int symbol = VP8LReadBits(br, (first_symbol_len_code == 0) ? 1 : 8);
    code_lengths[symbol] = 1;
    // The second code (if present), is always 8 bit long.
    if (num_symbols == 2) {
      symbol = VP8LReadBits(br, 8);
      code_lengths[symbol] = 1;
    }
    ok = 1;
  } else {  // Decode Huffman-coded code lengths.
    int i;
    int code_length_code_lengths[NUM_CODE_LENGTH_CODES] = { 0 };
    const int num_codes = VP8LReadBits(br, 4) + 4;
    if (num_codes > NUM_CODE_LENGTH_CODES) {
      dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
      return 0;
    }

    for (i = 0; i < num_codes; ++i) {
      code_length_code_lengths[kCodeLengthCodeOrder[i]] = VP8LReadBits(br, 3);
    }
    ok = ReadHuffmanCodeLengths(dec, code_length_code_lengths, alphabet_size,
                                code_lengths);
  }

  ok = ok && !br->eos_;
  if (ok) {
    size = VP8LBuildHuffmanTable(table, HUFFMAN_TABLE_BITS,
                                 code_lengths, alphabet_size);
  }
  if (!ok || size == 0) {
    dec->status_ = VP8_STATUS_BITSTREAM_ERROR;
    return 0;
  }
  return size;
}